

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O1

int minfit(double *AB,int M,int N,int P,double *q)

{
  long lVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *__ptr;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  int iVar16;
  void *pvVar17;
  long lVar18;
  long lVar19;
  ulong in_R9;
  long lVar20;
  int iVar21;
  double *pdVar22;
  ulong uVar23;
  double *pdVar24;
  double *pdVar25;
  ulong uVar26;
  long lVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double __x;
  double dVar33;
  double dVar34;
  double dVar35;
  long local_138;
  int local_88;
  ulong local_38;
  
  uVar26 = (ulong)(uint)N;
  __ptr = malloc((long)N * 8);
  dVar28 = macheps();
  iVar4 = P + N;
  pdVar2 = AB + 1;
  lVar12 = (long)iVar4;
  if (N < 1) {
    dVar35 = 0.0;
    dVar29 = 0.0;
  }
  else {
    lVar20 = (long)M;
    pdVar8 = AB + lVar12;
    uVar13 = 1;
    dVar35 = 0.0;
    pvVar17 = __ptr;
    uVar11 = 0;
    pdVar25 = pdVar2;
    pdVar24 = AB;
    uVar23 = uVar26;
    dVar31 = 0.0;
    local_38 = (ulong)(uint)M;
    do {
      *(double *)((long)__ptr + uVar11 * 8) = dVar35;
      dVar35 = 0.0;
      uVar7 = local_38;
      pdVar22 = pdVar24;
      if ((long)uVar11 < lVar20) {
        do {
          dVar35 = dVar35 + *pdVar22 * *pdVar22;
          uVar7 = uVar7 - 1;
          pdVar22 = pdVar22 + lVar12;
        } while (uVar7 != 0);
      }
      in_R9 = uVar11 + 1;
      dVar29 = 0.0;
      if (dVar28 * dVar28 <= dVar35) {
        iVar5 = (iVar4 + 1) * (int)uVar11;
        dVar34 = AB[iVar5];
        if (dVar35 < 0.0) {
          dVar29 = sqrt(dVar35);
        }
        else {
          dVar29 = SQRT(dVar35);
        }
        dVar29 = (double)(~-(ulong)(dVar34 < 0.0) & (ulong)-dVar29 |
                         -(ulong)(dVar34 < 0.0) & (ulong)dVar29);
        AB[iVar5] = dVar34 - dVar29;
        if ((long)in_R9 < lVar12) {
          pdVar22 = pdVar25;
          uVar7 = uVar13;
          do {
            dVar30 = 0.0;
            if ((long)uVar11 < lVar20) {
              lVar18 = 0;
              uVar14 = local_38;
              do {
                dVar30 = dVar30 + *(double *)((long)pdVar24 + lVar18) *
                                  *(double *)((long)pdVar22 + lVar18);
                lVar18 = lVar18 + lVar12 * 8;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            if ((long)uVar11 < lVar20) {
              lVar18 = 0;
              uVar14 = local_38;
              do {
                *(double *)((long)pdVar22 + lVar18) =
                     *(double *)((long)pdVar24 + lVar18) * (dVar30 / (dVar34 * dVar29 - dVar35)) +
                     *(double *)((long)pdVar22 + lVar18);
                lVar18 = lVar18 + lVar12 * 8;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            uVar7 = uVar7 + 1;
            pdVar22 = pdVar22 + 1;
          } while ((long)uVar7 < lVar12);
        }
      }
      dVar34 = 0.0;
      q[uVar11] = dVar29;
      if (in_R9 < uVar26 && (long)uVar11 < lVar20) {
        dVar34 = 0.0;
        uVar7 = 1;
        do {
          dVar34 = dVar34 + pdVar24[uVar7] * pdVar24[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar23 != uVar7);
      }
      dVar35 = 0.0;
      if (dVar28 * dVar28 <= dVar34) {
        dVar29 = pdVar2[uVar11 * lVar12 + uVar11];
        if (dVar34 < 0.0) {
          dVar35 = sqrt(dVar34);
        }
        else {
          dVar35 = SQRT(dVar34);
        }
        dVar35 = (double)(~-(ulong)(dVar29 < 0.0) & (ulong)-dVar35 |
                         -(ulong)(dVar29 < 0.0) & (ulong)dVar35);
        pdVar2[uVar11 * lVar12 + uVar11] = dVar29 - dVar35;
        if (in_R9 < uVar26) {
          uVar7 = 1;
          do {
            *(double *)((long)pvVar17 + uVar7 * 8) = pdVar24[uVar7] / (dVar29 * dVar35 - dVar34);
            uVar7 = uVar7 + 1;
          } while (uVar23 != uVar7);
        }
        pdVar22 = pdVar8;
        uVar7 = uVar13;
        if ((long)in_R9 < lVar20) {
          do {
            dVar29 = 0.0;
            if (in_R9 < uVar26) {
              uVar14 = 1;
              do {
                dVar29 = dVar29 + pdVar22[uVar14] * pdVar24[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar23 != uVar14);
            }
            if (in_R9 < uVar26) {
              uVar14 = 1;
              do {
                pdVar22[uVar14] = *(double *)((long)pvVar17 + uVar14 * 8) * dVar29 + pdVar22[uVar14]
                ;
                uVar14 = uVar14 + 1;
              } while (uVar23 != uVar14);
            }
            uVar7 = uVar7 + 1;
            pdVar22 = pdVar22 + lVar12;
          } while (uVar7 != (uint)M);
        }
      }
      dVar29 = ABS(*(double *)((long)__ptr + uVar11 * 8)) + ABS(q[uVar11]);
      if (dVar29 <= dVar31) {
        dVar29 = dVar31;
      }
      uVar13 = uVar13 + 1;
      pdVar24 = pdVar24 + lVar12 + 1;
      local_38 = local_38 - 1;
      pdVar25 = pdVar25 + lVar12 + 1;
      uVar23 = uVar23 - 1;
      pvVar17 = (void *)((long)pvVar17 + 8);
      pdVar8 = pdVar8 + lVar12 + 1;
      uVar11 = in_R9;
      dVar31 = dVar29;
    } while (in_R9 != uVar26);
  }
  if (0 < N) {
    pdVar8 = AB + (uVar26 - 1) * lVar12;
    lVar20 = lVar12 * 8;
    pdVar25 = AB + uVar26;
    uVar11 = uVar26;
    do {
      pdVar25 = pdVar25 + -1;
      uVar23 = uVar11 - 1;
      lVar18 = (long)(iVar4 * (int)uVar23);
      local_88 = (int)in_R9;
      if ((dVar35 != 0.0) || (NAN(dVar35))) {
        if (local_88 < N) {
          dVar31 = AB[uVar11 + lVar18];
          uVar13 = (ulong)local_88;
          pdVar24 = (double *)(lVar20 * uVar13 + (long)pdVar25);
          do {
            *pdVar24 = pdVar8[uVar13] / (dVar35 * dVar31);
            uVar13 = uVar13 + 1;
            pdVar24 = pdVar24 + lVar12;
          } while (uVar26 != uVar13);
        }
        if (local_88 < N) {
          uVar7 = (ulong)local_88;
          pdVar24 = (double *)((lVar12 * 8 + 8) * uVar7 + (long)AB);
          uVar13 = uVar7;
          do {
            dVar35 = 0.0;
            uVar14 = uVar7;
            pdVar22 = pdVar24;
            do {
              dVar35 = dVar35 + pdVar8[uVar14] * *pdVar22;
              uVar14 = uVar14 + 1;
              pdVar22 = pdVar22 + lVar12;
            } while (uVar26 != uVar14);
            lVar27 = 0;
            lVar19 = uVar26 - uVar7;
            do {
              *(double *)((long)pdVar24 + lVar27) =
                   *(double *)((long)pdVar25 + lVar27 + lVar20 * uVar7) * dVar35 +
                   *(double *)((long)pdVar24 + lVar27);
              lVar27 = lVar27 + lVar20;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
            uVar13 = uVar13 + 1;
            pdVar24 = pdVar24 + 1;
          } while (uVar13 != uVar26);
        }
      }
      if (local_88 < N) {
        uVar13 = (ulong)local_88;
        pdVar24 = (double *)(lVar20 * uVar13 + (long)pdVar25);
        do {
          *pdVar24 = 0.0;
          pdVar8[uVar13] = 0.0;
          uVar13 = uVar13 + 1;
          pdVar24 = pdVar24 + lVar12;
        } while (uVar26 != uVar13);
      }
      AB[uVar23 + lVar18] = 1.0;
      dVar35 = *(double *)((long)__ptr + uVar23 * 8);
      pdVar8 = pdVar8 + -lVar12;
      in_R9 = uVar23 & 0xffffffff;
      bVar3 = 1 < (long)uVar11;
      uVar11 = uVar23;
    } while (bVar3);
  }
  iVar5 = N - M;
  if (iVar5 != 0 && M <= N) {
    iVar16 = N + 1;
    if (N + 1 < iVar4) {
      iVar16 = iVar4;
    }
    iVar21 = M * iVar4 + N;
    do {
      if (0 < P) {
        memset(AB + iVar21,0,(ulong)(uint)(~N + iVar16) * 8 + 8);
      }
      iVar21 = iVar21 + iVar4;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  if (N < 1) {
LAB_001413c7:
    free(__ptr);
    return 0;
  }
  dVar28 = dVar28 * dVar29;
  uVar13 = (ulong)(N - 1U);
  lVar20 = lVar12 * 8;
  pdVar8 = AB + uVar26;
  local_138 = 0;
  uVar11 = uVar26;
  uVar23 = uVar26 - 1;
LAB_00140d89:
  pdVar8 = pdVar8 + -1;
  uVar7 = uVar23 - 1;
  iVar5 = 1;
  uVar14 = uVar11;
  lVar18 = local_138;
LAB_00140dc2:
  if (dVar28 < ABS(*(double *)((long)__ptr + lVar18 * 8 + uVar13 * 8))) {
    if (dVar28 < ABS(q[uVar13 + lVar18 + -1])) goto code_r0x00140de4;
    goto LAB_00140ded;
  }
  uVar14 = (ulong)((int)lVar18 + (N - 1U));
  goto LAB_00140f44;
code_r0x00140de4:
  lVar18 = lVar18 + -1;
  uVar6 = (int)uVar14 - 1;
  uVar14 = (ulong)uVar6;
  if (0 < (int)uVar6) goto LAB_00140dc2;
LAB_00140ded:
  uVar14 = lVar18 + uVar13;
  iVar16 = (int)uVar14;
  if ((long)iVar16 <= (long)uVar23) {
    iVar21 = (iVar16 + -1) * iVar4;
    pdVar25 = (double *)(lVar20 * iVar16 + (long)AB);
    dVar35 = 0.0;
    dVar29 = 1.0;
    lVar18 = (long)iVar16;
    do {
      dVar31 = *(double *)((long)__ptr + lVar18 * 8);
      dVar29 = dVar29 * dVar31;
      *(double *)((long)__ptr + lVar18 * 8) = dVar35 * dVar31;
      if (ABS(dVar29) <= dVar28) break;
      dVar35 = q[lVar18];
      dVar31 = hypot(dVar29,dVar35);
      q[lVar18] = dVar31;
      dVar35 = dVar35 / dVar31;
      dVar29 = -dVar29 / dVar31;
      uVar9 = uVar26;
      if (0 < P) {
        do {
          dVar31 = AB[(long)iVar21 + uVar9];
          dVar34 = pdVar25[uVar9];
          AB[(long)iVar21 + uVar9] = dVar31 * dVar35 + dVar29 * dVar34;
          pdVar25[uVar9] = dVar34 * dVar35 - dVar29 * dVar31;
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < lVar12);
      }
      pdVar25 = pdVar25 + lVar12;
      bVar3 = lVar18 < (long)uVar23;
      lVar18 = lVar18 + 1;
    } while (bVar3);
  }
LAB_00140f44:
  dVar35 = q[uVar23];
  if (uVar23 != (uVar14 & 0xffffffff)) {
    lVar18 = (long)(int)uVar14;
    dVar29 = q[lVar18];
    dVar31 = q[uVar7];
    dVar34 = *(double *)((long)__ptr + uVar7 * 8);
    dVar30 = *(double *)((long)__ptr + uVar23 * 8);
    dVar34 = ((dVar31 / dVar30 + ((dVar34 - dVar35) / dVar31) * ((dVar35 + dVar34) / dVar30)) -
             dVar30 / dVar31) * 0.5;
    dVar32 = hypot(dVar34,1.0);
    dVar35 = (dVar30 / dVar29) *
             (dVar31 / ((double)((ulong)-dVar32 & -(ulong)(dVar34 < 0.0) |
                                ~-(ulong)(dVar34 < 0.0) & (ulong)dVar32) + dVar34) - dVar30) +
             (dVar29 - (dVar35 / dVar29) * dVar35);
    if (lVar18 < (long)uVar23) {
      pdVar25 = pdVar2 + lVar18;
      lVar27 = lVar18 << 0x20;
      pdVar22 = (double *)((lVar18 + 1) * lVar20 + (long)AB);
      pdVar24 = (double *)(lVar20 * lVar18 + (long)AB);
      dVar34 = 1.0;
      dVar31 = 1.0;
      lVar19 = lVar18;
      do {
        lVar1 = lVar19 + 1;
        dVar30 = *(double *)((long)__ptr + lVar19 * 8 + 8);
        dVar32 = q[lVar19 + 1];
        dVar34 = dVar34 * dVar30;
        dVar31 = dVar31 * dVar30;
        dVar30 = hypot(dVar35,dVar34);
        *(double *)((long)__ptr + lVar19 * 8) = dVar30;
        dVar35 = dVar35 / dVar30;
        dVar30 = dVar34 / dVar30;
        __x = dVar29 * dVar35 + dVar31 * dVar30;
        dVar29 = dVar31 * dVar35 - dVar30 * dVar29;
        dVar34 = dVar32 * dVar30;
        dVar32 = dVar32 * dVar35;
        uVar14 = uVar26;
        lVar10 = lVar27;
        pdVar15 = pdVar25;
        do {
          dVar31 = *(double *)((long)AB + (lVar10 >> 0x1d));
          dVar33 = *pdVar15;
          *(double *)((long)AB + (lVar10 >> 0x1d)) = dVar31 * dVar35 + dVar30 * dVar33;
          *pdVar15 = dVar33 * dVar35 - dVar30 * dVar31;
          pdVar15 = pdVar15 + lVar12;
          lVar10 = lVar10 + (lVar12 << 0x20);
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
        dVar33 = hypot(__x,dVar34);
        dVar34 = dVar34 / dVar33;
        if ((dVar33 == 0.0) && (!NAN(dVar33))) {
          dVar34 = dVar30;
        }
        dVar31 = __x / dVar33;
        if ((dVar33 == 0.0) && (!NAN(dVar33))) {
          dVar31 = dVar35;
        }
        q[lVar19] = dVar33;
        uVar14 = uVar26;
        if (0 < P) {
          do {
            dVar35 = pdVar24[uVar14];
            dVar30 = pdVar22[uVar14];
            pdVar24[uVar14] = dVar35 * dVar31 + dVar34 * dVar30;
            pdVar22[uVar14] = dVar30 * dVar31 - dVar34 * dVar35;
            uVar14 = uVar14 + 1;
          } while ((long)uVar14 < lVar12);
        }
        dVar35 = dVar31 * dVar29 + dVar32 * dVar34;
        dVar29 = dVar31 * dVar32 - dVar29 * dVar34;
        pdVar25 = pdVar25 + 1;
        lVar27 = lVar27 + 0x100000000;
        pdVar22 = pdVar22 + lVar12;
        pdVar24 = pdVar24 + lVar12;
        lVar19 = lVar1;
      } while (lVar1 < (long)uVar23);
    }
    *(undefined8 *)((long)__ptr + lVar18 * 8) = 0;
    *(double *)((long)__ptr + uVar23 * 8) = dVar35;
    q[uVar23] = dVar29;
    iVar5 = iVar5 + 1;
    uVar14 = uVar11;
    lVar18 = local_138;
    if (iVar5 == 0x33) {
      puts("Convergence Not Achieved ");
      return 0xf;
    }
    goto LAB_00140dc2;
  }
  if (dVar35 < 0.0) {
    q[uVar23] = -dVar35;
    uVar14 = uVar26;
    pdVar25 = pdVar8;
    do {
      *pdVar25 = -*pdVar25;
      pdVar25 = pdVar25 + lVar12;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  local_138 = local_138 + -1;
  uVar11 = (ulong)((int)uVar11 - 1);
  bVar3 = (long)uVar23 < 1;
  uVar23 = uVar7;
  if (bVar3) goto LAB_001413c7;
  goto LAB_00140d89;
}

Assistant:

int minfit(double *AB,int M,int N,int P,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1,np,n1;
	double eps,g,x,s,temp,f,h,tol,c,y,z;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE MINFIT,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * AB MAX(M,N) X (N+P)
	 * q N X 1
	 *
	 * On Input AB = [A:B]
	 * On Output AB = [V:C] where C = U'*B
	 */

	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	tol = eps * eps;
	g = x = 0.0;
	np = N + P;

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = g;
		s = 0.0;

		for(k = i; k < M;++k) {
			t = k * np;
			temp = AB[t+i];
			s += temp*temp;
		}
		if (s < tol) {
			g = 0.0;
		} else {
			f = AB[i*np+i];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
			AB[i*np+i] = f - g;

			for(j = l; j < np;++j) {
				s = 0.0;
				for(k = i; k < M;++k) {
					t = k * np;
					s += (AB[t+i]*AB[t+j]);
				}
				f = s / h;
				for(k = i; k < M;++k) {
					t = k * np;
					AB[t+j] += (f * AB[t+i]);
				}
			}

		}

        q[i] = g;
        s = 0.0;
        t = i * np;
        if (i < M) {
			for(k = l; k < N;++k) {
				temp = AB[t+k];
				s = s + temp*temp;
			}
        }
        if (s < tol) {
        	g = 0.0;
        } else {
        	f = AB[t+i+1];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
            AB[t+i+1] = f - g;
            for(k = l;k < N;++k) {
              	e[k] = AB[t+k] / h;
            }

            for (j = l; j < M; j++) {
                s = 0.0;
                t2 = j * np;
                for (k = l; k < N; k++) {
                     s += AB[t2+k] * AB[t+k];
                }
                for (k = l; k < N; k++) {
                     AB[t2+k] += s * e[k];
                }
            }

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}

	//Accumulating Right Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * np;
		if (g != 0.0) {
			h = AB[t+i+1] * g;
			for(j = l;j < N;++j) {
				AB[j*np+i] = AB[t+j] / h;
			}
			for(j = l;j < N;++j) {
				s = 0.0;
				for(k = l; k < N;++k) {
					s += AB[t+k] * AB[k*np+j];
				}
				for(k = l; k < N;++k) {
					AB[k*np+j] += (s * AB[k*np+i]);
				}
			}
		}
		for(j = l; j < N;++j) {
			AB[t+j] = AB[j*np+i] = 0.0;
		}

		AB[t+i] = 1.0;
		g = e[i];
		l = i;
	}

	eps = eps *x;
	n1 = N + 1;

	for(i = M; i < N;++i) {
		for(j = n1 - 1; j < np;++j)  {
			AB[i * np +j] = 0.0;
		}
	}

	for(k = N - 1; k >= 0; --k) {
		iter = 0;

		while(1) {
			iter++;
			if (iter > SVDMAXITER) {
				printf("Convergence Not Achieved \n");
				return 15;
			}

			cancel = 1;
			for(l = k; l >= 0; --l) {
				if (fabs(e[l]) <= eps) {
					cancel = 0; //test f convergence
					break;
				}
				if (fabs(q[l-1]) <= eps) {
					//Cancel
					break;
				}
			}
			if (cancel) {
				c = 0.0;
				s = 1.0;
				l1 = l - 1;
				for(i = l; i <= k;++i) {
					f = s*e[i];
					e[i] *= c;
					if (fabs(f) <= eps) {
						break;
					}
					g = q[i];
					h = q[i] = hypot(f,g);
					c = g/h;
					s = -f/h;
					for(j = n1-1; j < np;++j) {
						y = AB[l1 * np + j];
						z = AB[i * np + j];

						AB[l1 * np + j] = y * c + z * s;
						AB[i * np + j] = z * c - y * s;
					}
				}
			}
			z = q[k];
			if (l != k) {
				x = q[l];
				y = q[k-1];
				g = e[k-1];
				h = e[k];
				f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
				g = hypot(f,1.0);
				if (f < 0.0) {
					temp = f - g;
				} else {
					temp = f+g;
				}
				f = x - (z / x) * z + (h / x) * (y / temp - h);

				//Next QR Transformation

				c = s = 1.0;
				for(i = l+1; i <= k;++i) {
					g = e[i];
					y = q[i];
					h = s * g;
					g = c * g;
					e[i-1] = z = hypot(f,h);
                    c = f / z;
                    s = h / z;
                    f = x * c + g * s;
                    g = g * c - x * s;
                    h = y * s;
                    y *= c;
                    for(j = 0; j < N;++j) {
                    	t = j * np;
                        x = AB[t+i-1];
                        z = AB[t+i];
                        AB[t+i-1] = x * c + z * s;
                        AB[t+i] = z * c - x * s;
                    }
                    q[i-1] = z = hypot(f,h);
                    if (z != 0.0) {
                        c = f / z;
                        s = h / z;
                    }
                    f = c * g + s * y;
                    x = c * y - s * g;
                    for(j = n1-1; j < np;++j) {
                        y = AB[(i-1) * np + j];
                        z = AB[i * np + j];
                        AB[(i-1) * np + j] = y * c + z * s;
                        AB[i * np + j] = z * c - y * s;
                    }
				}
                    e[l] = 0.0;
                    e[k] = f;
                    q[k] = x;

			} else {
				//convergence
                if (z < 0.0) {
                    q[k] = -z;
                    for (j = 0; j < N; j++) {
                    	t = j * np;
                        AB[t+k] = -AB[t+k];
                    }
                }
                break;
			}
		}
	}

	free(e);
	return ierr;

}